

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aes.c
# Opt level: O0

void br_aes_ct64_ortho(uint64_t *q)

{
  ulong uVar1;
  ulong *in_RDI;
  uint64_t b_3;
  uint64_t a_3;
  uint64_t b_2;
  uint64_t a_2;
  uint64_t b_1;
  uint64_t a_1;
  uint64_t b;
  uint64_t a;
  uint64_t b_11;
  uint64_t a_11;
  uint64_t b_10;
  uint64_t a_10;
  uint64_t b_9;
  uint64_t a_9;
  uint64_t b_8;
  uint64_t a_8;
  uint64_t b_7;
  uint64_t a_7;
  uint64_t b_6;
  uint64_t a_6;
  uint64_t b_5;
  uint64_t a_5;
  uint64_t b_4;
  uint64_t a_4;
  
  uVar1 = *in_RDI;
  *in_RDI = uVar1 & 0x5555555555555555 | (in_RDI[1] & 0x5555555555555555) << 1;
  in_RDI[1] = (uVar1 & 0xaaaaaaaaaaaaaaaa) >> 1 | in_RDI[1] & 0xaaaaaaaaaaaaaaaa;
  uVar1 = in_RDI[2];
  in_RDI[2] = uVar1 & 0x5555555555555555 | (in_RDI[3] & 0x5555555555555555) << 1;
  in_RDI[3] = (uVar1 & 0xaaaaaaaaaaaaaaaa) >> 1 | in_RDI[3] & 0xaaaaaaaaaaaaaaaa;
  uVar1 = in_RDI[4];
  in_RDI[4] = uVar1 & 0x5555555555555555 | (in_RDI[5] & 0x5555555555555555) << 1;
  in_RDI[5] = (uVar1 & 0xaaaaaaaaaaaaaaaa) >> 1 | in_RDI[5] & 0xaaaaaaaaaaaaaaaa;
  uVar1 = in_RDI[6];
  in_RDI[6] = uVar1 & 0x5555555555555555 | (in_RDI[7] & 0x5555555555555555) << 1;
  in_RDI[7] = (uVar1 & 0xaaaaaaaaaaaaaaaa) >> 1 | in_RDI[7] & 0xaaaaaaaaaaaaaaaa;
  uVar1 = *in_RDI;
  *in_RDI = uVar1 & 0x3333333333333333 | (in_RDI[2] & 0x3333333333333333) << 2;
  in_RDI[2] = (uVar1 & 0xcccccccccccccccc) >> 2 | in_RDI[2] & 0xcccccccccccccccc;
  uVar1 = in_RDI[1];
  in_RDI[1] = uVar1 & 0x3333333333333333 | (in_RDI[3] & 0x3333333333333333) << 2;
  in_RDI[3] = (uVar1 & 0xcccccccccccccccc) >> 2 | in_RDI[3] & 0xcccccccccccccccc;
  uVar1 = in_RDI[4];
  in_RDI[4] = uVar1 & 0x3333333333333333 | (in_RDI[6] & 0x3333333333333333) << 2;
  in_RDI[6] = (uVar1 & 0xcccccccccccccccc) >> 2 | in_RDI[6] & 0xcccccccccccccccc;
  uVar1 = in_RDI[5];
  in_RDI[5] = uVar1 & 0x3333333333333333 | (in_RDI[7] & 0x3333333333333333) << 2;
  in_RDI[7] = (uVar1 & 0xcccccccccccccccc) >> 2 | in_RDI[7] & 0xcccccccccccccccc;
  uVar1 = *in_RDI;
  *in_RDI = uVar1 & 0xf0f0f0f0f0f0f0f | (in_RDI[4] & 0xf0f0f0f0f0f0f0f) << 4;
  in_RDI[4] = (uVar1 & 0xf0f0f0f0f0f0f0f0) >> 4 | in_RDI[4] & 0xf0f0f0f0f0f0f0f0;
  uVar1 = in_RDI[1];
  in_RDI[1] = uVar1 & 0xf0f0f0f0f0f0f0f | (in_RDI[5] & 0xf0f0f0f0f0f0f0f) << 4;
  in_RDI[5] = (uVar1 & 0xf0f0f0f0f0f0f0f0) >> 4 | in_RDI[5] & 0xf0f0f0f0f0f0f0f0;
  uVar1 = in_RDI[2];
  in_RDI[2] = uVar1 & 0xf0f0f0f0f0f0f0f | (in_RDI[6] & 0xf0f0f0f0f0f0f0f) << 4;
  in_RDI[6] = (uVar1 & 0xf0f0f0f0f0f0f0f0) >> 4 | in_RDI[6] & 0xf0f0f0f0f0f0f0f0;
  uVar1 = in_RDI[3];
  in_RDI[3] = uVar1 & 0xf0f0f0f0f0f0f0f | (in_RDI[7] & 0xf0f0f0f0f0f0f0f) << 4;
  in_RDI[7] = (uVar1 & 0xf0f0f0f0f0f0f0f0) >> 4 | in_RDI[7] & 0xf0f0f0f0f0f0f0f0;
  return;
}

Assistant:

static void br_aes_ct64_ortho(uint64_t *q) {
#define SWAPN(cl, ch, s, x, y)   do { \
        uint64_t a, b; \
        a = (x); \
        b = (y); \
        (x) = (a & (uint64_t)(cl)) | ((b & (uint64_t)(cl)) << (s)); \
        (y) = ((a & (uint64_t)(ch)) >> (s)) | (b & (uint64_t)(ch)); \
    } while (0)

#define SWAP2(x, y)    SWAPN(0x5555555555555555, 0xAAAAAAAAAAAAAAAA,  1, x, y)
#define SWAP4(x, y)    SWAPN(0x3333333333333333, 0xCCCCCCCCCCCCCCCC,  2, x, y)
#define SWAP8(x, y)    SWAPN(0x0F0F0F0F0F0F0F0F, 0xF0F0F0F0F0F0F0F0,  4, x, y)

    SWAP2(q[0], q[1]);
    SWAP2(q[2], q[3]);
    SWAP2(q[4], q[5]);
    SWAP2(q[6], q[7]);

    SWAP4(q[0], q[2]);
    SWAP4(q[1], q[3]);
    SWAP4(q[4], q[6]);
    SWAP4(q[5], q[7]);

    SWAP8(q[0], q[4]);
    SWAP8(q[1], q[5]);
    SWAP8(q[2], q[6]);
    SWAP8(q[3], q[7]);
}